

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_.cpp
# Opt level: O2

void __thiscall vector_<char>::resize(vector_<char> *this)

{
  char *pcVar1;
  ulong uVar2;
  pointer __p_00;
  pointer __p;
  int i;
  ulong uVar3;
  __uniq_ptr_impl<char,_std::default_delete<char[]>_> local_28;
  
  uVar2 = this->capacity * 2;
  this->capacity = uVar2;
  __p_00 = (pointer)operator_new__(uVar2);
  memset(__p_00,0,uVar2);
  pcVar1 = (this->arr)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
           super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
           super__Head_base<0UL,_char_*,_false>._M_head_impl;
  uVar2 = this->_size;
  for (uVar3 = 0; uVar3 < uVar2; uVar3 = uVar3 + 1) {
    __p_00[uVar3] = pcVar1[uVar3];
  }
  local_28._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
  super__Head_base<0UL,_char_*,_false>._M_head_impl =
       (tuple<char_*,_std::default_delete<char[]>_>)
       (_Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>)0x0;
  std::__uniq_ptr_impl<char,_std::default_delete<char[]>_>::reset
            ((__uniq_ptr_impl<char,_std::default_delete<char[]>_> *)&this->arr,__p_00);
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)&local_28);
  return;
}

Assistant:

void resize() {
        capacity *= 2;
        auto temp = make_unique<T[]>(capacity);
        for (int i = 0; i < _size; i++) {
            temp[i] = arr[i];
        }
        arr = std::move(temp);
    }